

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  ct_constant<8L> c8;
  expr substi1;
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  local_128;
  vector_expr vec2;
  expr vec_expr;
  expr substi2;
  expr uv;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  vector_expr vec;
  expr x_pow_4;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  variable z;
  vector_expr vec3;
  function_symbol v;
  variable x;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> local_38;
  
  x.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00117868;
  x.id_ = 0;
  z.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00117868;
  z.id_ = 2;
  c4.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001177a8;
  c4.s = 4.0;
  c6.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00117968;
  c6.s = 6;
  local_38.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00117a28;
  local_38.id_ = 0;
  local_38.tag_id_ = 0;
  v.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00117a28;
  v.id_ = 0;
  v.tag_id_ = 1;
  viennamath::result_of::
  mult<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance((type *)&vec2,&x,&x);
  viennamath::result_of::
  mult<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance((type *)&vec3,&x,&x);
  viennamath::result_of::
  mult<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance((type *)&vec,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&vec2,
             (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&vec3);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&x_pow_4,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&vec);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&vec);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&vec3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&vec2);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr(&vec,3);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=
            (vec.
             super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             .
             super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&x);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (&vec2,&vec);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)
             (vec.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),&c6);
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (&vec3,(long)vec2.
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         .
                         super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vec2.
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         .
                         super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::operator=(&vec3.
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ,&vec2.
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             );
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)
             (vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),&c8);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
            ((rt_expr<viennamath::rt_expression_interface<double>> *)
             (vec2.
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              .
              super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),&c6);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec: ");
  poVar1 = viennamath::operator<<(poVar1,&vec);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec2: ");
  poVar1 = viennamath::operator<<(poVar1,&vec2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec3: ");
  poVar1 = viennamath::operator<<(poVar1,&vec3);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec + vec2: ");
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator+
            ((self_type *)&substi1,&vec,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec - vec2: ");
  viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator-
            ((self_type *)&substi1,&vec,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"z * vec2: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&z,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec2 * z: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&vec2,&z);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"c4 * vec2: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&c4,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec2 * c4: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&vec2,&c4);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"c6 * vec2: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&c6,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec2 * c6: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&vec2,&c6);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"c6 * vec2: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&c8,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec2 * c6: ");
  viennamath::operator*
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&vec2,&c8);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"c6 / vec2: ");
  viennamath::operator/
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&c6,&vec2);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec2 / z: ");
  viennamath::operator/
            ((rt_vector_expr<viennamath::rt_expression_interface<double>_> *)&substi1,&vec2,&c6);
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                             &substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&local_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"----------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec * vec2: ");
  viennamath::operator*((viennamath *)&substi1,&vec,&vec2);
  poVar1 = viennamath::operator<<(poVar1,&substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (substi1.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (**(code **)(*(long *)substi1.rt_expr_._M_ptr + 8))();
  }
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&vec_expr,&vec);
  poVar1 = std::operator<<((ostream *)&std::cout,"vec as expr: ");
  poVar1 = viennamath::operator<<(poVar1,&vec_expr);
  std::endl<char,std::char_traits<char>>(poVar1);
  viennamath::result_of::
  mult<viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>,_viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance((type *)&substi1,&local_38,&v);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&uv,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&substi1);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&substi1);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&substi1,&local_38,&vec_expr,&uv);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&substi2,&v,&vec_expr,&substi1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Substituted 1: ");
  poVar1 = viennamath::operator<<(poVar1,&substi1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Substituted 2: ");
  poVar1 = viennamath::operator<<(poVar1,&substi2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (substi2.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (**(code **)(*(long *)substi2.rt_expr_._M_ptr + 8))();
  }
  if (substi1.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (**(code **)(*(long *)substi1.rt_expr_._M_ptr + 8))();
  }
  if (uv.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (**(code **)(*(long *)uv.rt_expr_._M_ptr + 8))();
  }
  if (vec_expr.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (**(code **)(*(long *)vec_expr.rt_expr_._M_ptr + 8))();
  }
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&vec3.
             super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           );
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&vec2.
             super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           );
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::~vector(&vec.
             super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           );
  if (x_pow_4.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (**(code **)(*(long *)x_pow_4.rt_expr_._M_ptr + 8))();
  }
  return 0;
}

Assistant:

int main()
{
  viennamath::variable x(0);
  viennamath::variable y(1);
  viennamath::variable z(2);
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;
  viennamath::function_symbol u(0, viennamath::unknown_tag<>());
  viennamath::function_symbol v(0, viennamath::test_tag<>());
  viennamath::expr x_pow_4 = (x*x)*(x*x);

  viennamath::vector_expr  vec(3);
  vec[0] = x;
  //vec[1] = c6;             //uncomment this is you do not want to have the default constant '0' here
  //vec[2] = x*y + z - c6;   //uncomment this is you do not want to have the default constant '0' here

  viennamath::vector_expr  vec2(vec);
  vec[1] = c6;

  viennamath::vector_expr  vec3(vec2.size());
  vec3 = vec2;
  vec2[1] = c8;
  vec2[2] = c6;

  std::cout << "vec: " << vec << std::endl;
  std::cout << "vec2: " << vec2 << std::endl;
  std::cout << "vec3: " << vec3 << std::endl;
  std::cout << "----------------------" << std::endl;
  std::cout << "vec + vec2: " << vec + vec2 << std::endl;
  std::cout << "vec - vec2: " << vec - vec2 << std::endl;

  // check multiplication:
  std::cout << "z * vec2: "   << z * vec2   << std::endl;
  std::cout << "vec2 * z: "   << vec2 * z   << std::endl;

  std::cout << "c4 * vec2: "   << c4 * vec2   << std::endl;
  std::cout << "vec2 * c4: "   << vec2 * c4   << std::endl;

  std::cout << "c6 * vec2: "   << c6 * vec2   << std::endl;
  std::cout << "vec2 * c6: "   << vec2 * c6   << std::endl;

  std::cout << "c6 * vec2: "   << c8 * vec2   << std::endl;
  std::cout << "vec2 * c6: "   << vec2 * c8   << std::endl;

  // check division:
  std::cout << "c6 / vec2: "  << c6 / vec2  << std::endl;
  std::cout << "vec2 / z: "   << vec2 / c6  << std::endl;


  std::cout << "----------------------" << std::endl;
  std::cout << "vec * vec2: "   << vec * vec2  << std::endl;

  viennamath::expr vec_expr = vec;
  std::cout << "vec as expr: " << vec_expr << std::endl;


  viennamath::expr uv = u*v;
  viennamath::expr substi1 = viennamath::substitute(u, vec_expr, uv);
  viennamath::expr substi2 = viennamath::substitute(v, vec_expr, substi1);
  std::cout << "Substituted 1: " << substi1 << std::endl;
  std::cout << "Substituted 2: " << substi2 << std::endl;


  std::cout << "****************************************************" << std::endl;
  std::cout << "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "****************************************************" << std::endl;

  return EXIT_SUCCESS;
}